

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O0

void __thiscall sqlite::database::database(database *this,string *db_name,sqlite_config *config)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *peVar3;
  char *pcVar4;
  str_ref sql;
  int local_c8;
  str_ref local_a8;
  database_binder local_98;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  int local_58 [2];
  shared_ptr<sqlite3> local_50 [2];
  int local_2c;
  undefined8 uStack_28;
  int ret;
  sqlite3 *tmp;
  sqlite_config *config_local;
  string *db_name_local;
  database *this_local;
  
  tmp = (sqlite3 *)config;
  config_local = (sqlite_config *)db_name;
  db_name_local = (string *)this;
  std::shared_ptr<sqlite3>::shared_ptr(&this->_db,(nullptr_t)0x0);
  uStack_28 = 0;
  uVar2 = std::__cxx11::string::data();
  pcVar4 = *(char **)(tmp + 8);
  local_2c = sqlite3_open_v2(uVar2,&stack0xffffffffffffffd8,*(undefined4 *)tmp);
  std::shared_ptr<sqlite3>::
  shared_ptr<sqlite3,sqlite::database::database(std::__cxx11::string_const&,sqlite::sqlite_config_const&)::_lambda(sqlite3*)_1_,void>
            (local_50,uStack_28);
  std::shared_ptr<sqlite3>::operator=(&this->_db,local_50);
  std::shared_ptr<sqlite3>::~shared_ptr(local_50);
  if (local_2c != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      peVar3 = std::__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_c8 = sqlite3_extended_errcode(peVar3);
    }
    else {
      local_c8 = local_2c;
    }
    local_58[0] = local_c8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"");
    sql._M_str = pcVar4;
    sql._M_len = (size_t)local_68._M_str;
    errors::throw_sqlite_error((errors *)local_58,(int *)local_68._M_len,sql);
  }
  peVar3 = std::__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2> *)this);
  sqlite3_extended_result_codes(peVar3,1);
  if (*(int *)(tmp + 0x10) == 4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a8,"PRAGMA encoding = \"UTF-16\";");
    operator<<(&local_98,this,local_a8);
    database_binder::~database_binder(&local_98);
  }
  return;
}

Assistant:

database(const std::string &db_name, const sqlite_config &config = {}): _db(nullptr) {
			sqlite3* tmp = nullptr;
			auto ret = sqlite3_open_v2(db_name.data(), &tmp, static_cast<int>(config.flags), config.zVfs);
			_db = std::shared_ptr<sqlite3>(tmp, [=](sqlite3* ptr) { sqlite3_close_v2(ptr); }); // this will close the connection eventually when no longer needed.
			if(ret != SQLITE_OK) errors::throw_sqlite_error(_db ? sqlite3_extended_errcode(_db.get()) : ret);
			sqlite3_extended_result_codes(_db.get(), true);
			if(config.encoding == Encoding::UTF16)
				*this << R"(PRAGMA encoding = "UTF-16";)";
		}